

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeGuard.cc
# Opt level: O3

void dismiss_test(void)

{
  int iVar1;
  UnitTest *pUVar2;
  ostream *poVar3;
  undefined8 uVar4;
  bool flag;
  ScopeGuard s;
  char local_59;
  _Any_data local_58;
  _Manager_type local_48 [2];
  undefined1 local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._M_unused._M_object = &local_59;
  local_59 = '\x01';
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc:44:22)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc:44:22)>
             ::_M_manager;
  std::function<void_()>::function((function<void_()> *)&local_58,(function<void_()> *)&local_30);
  local_38 = 0;
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  local_38 = 1;
  ScopeGuard::~ScopeGuard((ScopeGuard *)&local_58);
  pUVar2 = UnitTest::getInstance();
  iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
  if ((char)iVar1 == '\0') {
    pUVar2 = UnitTest::getInstance();
    local_58._M_unused._M_object = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc"
               ,"");
    std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
    if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
      operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
    }
    pUVar2 = UnitTest::getInstance();
    pUVar2->last_checked_line_ = 0x2f;
    if (local_59 == '\0') {
      pUVar2 = UnitTest::getInstance();
      pUVar2->failure_num_ = pUVar2->failure_num_ + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>> check \"",0xb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"flag",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" failed.",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"at ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc"
                 ,0x55);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&AbortThisCase::typeinfo,0);
}

Assistant:

TEST_CASE(dismiss_test)
{
    bool flag = true;
    {
        ScopeGuard s{[&]{ flag = false; }};
        s.dismiss();
    }
    TEST_CHECK(flag);
}